

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O1

void do_whois(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  long lVar2;
  BUFFER *buffer_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  CClass *pCVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char **ppcVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  uint uVar11;
  CHAR_DATA *victim;
  DESCRIPTOR_DATA *pDVar12;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string_view fmt_00;
  format_args args_00;
  char *class_name;
  char **local_3a00;
  short *local_39f8;
  long local_39f0;
  BUFFER *local_39e8;
  string buffer;
  char **local_39c0 [2];
  char *local_39b0 [2];
  long local_39a0;
  char *local_3998;
  char **local_3990;
  char *local_3988;
  char *local_3980;
  char *local_3978;
  char *local_3970;
  char *local_3968;
  char *local_3960;
  char *local_3958;
  char *local_3950;
  string local_3948;
  char *local_3928;
  char *local_3918;
  char *local_3908;
  char *local_38f8;
  char *local_38e8;
  char *local_38d8;
  char *local_38c8;
  char *local_38b8;
  char *local_38a8;
  char **local_3898;
  char *local_3888;
  char *local_3878 [4];
  undefined1 local_3858 [32];
  char *local_3838 [2];
  char *local_3828;
  char *local_3818;
  char disp [4608];
  char rbuf [4608];
  char arg [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    send_to_char("Whois who?\n\r",ch);
    return;
  }
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  local_39e8 = new_buf();
  if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
    local_3990 = &PTR_grow_00457340;
    bVar4 = false;
    pDVar12 = descriptor_list;
    do {
      if ((pDVar12->connected != 0) || (bVar3 = can_see(ch,pDVar12->character), !bVar3))
      goto LAB_0024ff8b;
      victim = pDVar12->original;
      if (victim == (CHAR_DATA *)0x0) {
        victim = pDVar12->character;
      }
      bVar3 = can_see(ch,victim);
      if ((!bVar3) || (bVar3 = is_affected(pDVar12->character,(int)gsn_disguise), bVar3))
      goto LAB_0024ff8b;
      bVar3 = str_cmp(victim->name,victim->true_name);
      ppcVar10 = &victim->name;
      local_3a00 = &victim->true_name;
      ppcVar7 = ppcVar10;
      if (((bVar3) && (bVar3 = is_immortal(ch), ppcVar7 = local_3a00, !bVar3)) ||
         (bVar3 = str_prefix(arg,*ppcVar7), bVar3)) goto LAB_0024ff8b;
      pCVar6 = victim->my_class;
      if ((pCVar6 == (CClass *)0x0) &&
         ((victim->pIndexData == (MOB_INDEX_DATA *)0x0 ||
          (pCVar6 = victim->pIndexData->my_class, pCVar6 == (CClass *)0x0)))) {
        pCVar6 = CClass::GetClass(0);
      }
      class_name = RString::operator_cast_to_char_(&pCVar6->who_name);
      pcVar8 = "";
      switch(victim->level) {
      case 0x34:
        class_name = "AVA";
        pcVar8 = "Avatar ";
        break;
      case 0x35:
        class_name = "ANG";
        goto LAB_0024fbec;
      case 0x36:
        class_name = "DEM";
LAB_0024fbec:
        pcVar8 = " Minor ";
        break;
      case 0x37:
        class_name = "IMM";
        goto LAB_0024fc00;
      case 0x38:
        class_name = "GOD";
        goto LAB_0024fc00;
      case 0x39:
        class_name = "DEI";
LAB_0024fc00:
        pcVar8 = "Greater";
        break;
      case 0x3a:
        class_name = "SUP";
        goto LAB_0024fc14;
      case 0x3b:
        class_name = "CRE";
LAB_0024fc14:
        pcVar8 = " Elder ";
        break;
      case 0x3c:
        class_name = "IMP";
        pcVar8 = "Creator";
      }
      bVar4 = is_immortal(ch);
      local_39f8 = &victim->level;
      if ((bVar4) || ((bVar4 = is_heroimm(victim), bVar4 && (*local_39f8 < 0x34)))) {
        iVar5 = get_trust(ch);
        if (iVar5 < 0x34) {
          rbuf._0_2_ = rbuf._0_2_ & 0xff00;
        }
        else {
          rbuf[2] = '\0';
          rbuf[0] = ' ';
          rbuf[1] = ' ';
        }
        sVar1 = victim->race;
        iVar5 = get_trust(ch);
        if ((iVar5 < 0x34) ||
           (local_3948._M_dataplus._M_p = " *", victim->pcdata->history_buffer == (char *)0x0)) {
          local_3948._M_dataplus._M_p = rbuf;
        }
        local_39f0 = (long)sVar1;
        bVar4 = can_pk(ch,victim);
        pcVar8 = "";
        local_3878[0] = "";
        if (bVar4) {
          local_3878[0] = "(PK) ";
        }
        local_39c0[0] = (char **)0x3a5dc4;
        if (0x32 < victim->incog_level) {
          local_39c0[0] = (char **)0x386d8a;
        }
        local_3950 = "";
        if (0x32 < victim->invis_level) {
          local_3950 = "(Wizi) ";
        }
        sVar1 = victim->cabal;
        iVar5 = get_trust(ch);
        local_3958 = "";
        if ((0x38 < iVar5) && (local_3958 = "(MORON) ", (victim->act[0] & 0x200000) == 0)) {
          local_3958 = "";
        }
        local_3960 = "";
        if (((victim->comm[0] & 0x2000000) != 0) && (local_3960 = "", 0x33 < ch->level)) {
          local_3960 = "[AFK] ";
        }
        uVar11 = (uint)victim->act[0];
        local_3968 = "(WANTED) ";
        if ((uVar11 >> 0x1b & 1) == 0) {
          local_3968 = "";
        }
        local_3970 = "(THIEF) ";
        if ((uVar11 >> 0x19 & 1) == 0) {
          local_3970 = "";
        }
        local_3978 = "";
        bVar4 = is_npc(victim);
        if (!bVar4) {
          pcVar8 = victim->pcdata->title;
        }
        local_3980 = pcVar8;
        bVar4 = is_npc(victim);
        local_3988 = "";
        if ((!bVar4) && (local_3988 = victim->pcdata->extitle, local_3988 == (char *)0x0)) {
          local_3988 = "";
        }
        in_R9.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_3948;
        ::fmt::v9::
        sprintf<char[43],short,char*,char_const*,char_const*,char_const*,char_const*,char_const*,char*,char_const*,char_const*,char_const*,char_const*,char_const*,char*,char_const*,char_const*,char>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3858,
                   (v9 *)"[%2d %-5s %s%s] %s%s%s%s%s%s%s%s%s%s%s%s\n\r",(char (*) [43])local_39f8,
                   (short *)&pc_race_table[local_39f0].who_name_five,&class_name,
                   (char **)in_R9.values_,local_3878,(char **)local_39c0,&local_3950,
                   &cabal_table[sVar1].who_name,&local_3958,&local_3960,&local_3968,&local_3970,
                   &local_3978,local_3a00,&local_3980,&local_3988,(char **)class_name);
        std::__cxx11::string::operator=((string *)&buffer,(string *)local_3858);
        pcVar8 = (char *)local_3858._16_8_;
        ppcVar10 = (char **)local_3858._0_8_;
        if ((undefined1 *)local_3858._0_8_ != local_3858 + 0x10) {
LAB_0024ff71:
          operator_delete(ppcVar10,(ulong)(pcVar8 + 1));
        }
LAB_0024ff79:
        add_buf(local_39e8,buffer._M_dataplus._M_p);
      }
      else {
        iVar5 = get_trust(victim);
        if ((iVar5 < 0x34) || (bVar4 = is_immortal(ch), bVar4)) {
          if (victim->pcdata->shifted < 0) {
            bVar4 = is_immortal(victim);
            if (bVar4) {
              sprintf(disp,"*   %s  *",pcVar8);
            }
            else {
              sprintf(disp,"[%2d %-5s %s]",(ulong)(uint)(int)victim->level,
                      pc_race_table[victim->race].who_name_five,class_name);
            }
            bVar4 = can_pk(ch,victim);
            sVar1 = victim->incog_level;
            local_39f8 = (short *)CONCAT62(local_39f8._2_6_,victim->invis_level);
            if (victim->cabal == ch->cabal) {
LAB_00250059:
              local_3998 = cabal_table[victim->cabal].who_name;
            }
            else {
              bVar3 = is_immortal(victim);
              local_3998 = "";
              if (bVar3) goto LAB_00250059;
            }
            local_39f0 = CONCAT62(local_39f0._2_6_,sVar1);
            lVar2 = victim->act[0];
            local_39a0 = victim->comm[0];
            bVar3 = is_npc(victim);
            local_3a00 = (char **)0x3a5dc4;
            if (!bVar3) {
              local_3a00 = (char **)victim->pcdata->title;
            }
            bVar3 = is_npc(victim);
            local_3888 = "";
            if ((!bVar3) && (local_3888 = victim->pcdata->extitle, local_3888 == (char *)0x0)) {
              local_3888 = "";
            }
            local_3948.field_2._M_allocated_capacity = (size_type)"";
            if (bVar4) {
              local_3948.field_2._M_allocated_capacity = (size_type)"(PK) ";
            }
            local_3928 = "";
            if (0x32 < (short)local_39f0) {
              local_3928 = "(Incog) ";
            }
            local_3918 = "";
            if (0x32 < (short)local_39f8) {
              local_3918 = "(Wizi) ";
            }
            local_38e8 = "[AFK] ";
            if (((uint)local_39a0 >> 0x19 & 1) == 0) {
              local_38e8 = "";
            }
            uVar11 = (uint)lVar2;
            local_38d8 = "(WANTED) ";
            if ((uVar11 >> 0x1b & 1) == 0) {
              local_38d8 = "";
            }
            local_38a8 = *ppcVar10;
            local_3948._M_dataplus._M_p = disp;
            local_3908 = local_3998;
            local_38f8 = "";
            local_38c8 = "(THIEF) ";
            if ((uVar11 >> 0x19 & 1) == 0) {
              local_38c8 = "";
            }
            local_38b8 = "";
            local_3898 = local_3a00;
            local_3858._16_8_ = (char *)0x0;
            local_3858._0_8_ = local_3990;
            local_3858._8_8_ = local_3838;
            local_3858._24_8_ = 500;
            in_R9.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
            fmt.size_ = 0x1b;
            fmt.data_ = "{} {}{}{}{}{}{}{}{}{}{}{}\n\r";
            args.field_1.values_ =
                 (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_3948;
            args.desc_ = 0xccccccccccccc;
            ::fmt::v9::detail::vformat_to<char>((buffer<char> *)local_3858,fmt,args,(locale_ref)0x0)
            ;
            local_39c0[0] = local_39b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_39c0,local_3858._8_8_,
                       (char *)(local_3858._8_8_ + local_3858._16_8_));
            if ((char **)local_3858._8_8_ != local_3838) {
              operator_delete((void *)local_3858._8_8_,local_3858._24_8_);
            }
            std::__cxx11::string::operator=((string *)&buffer,(string *)local_39c0);
            pcVar8 = local_39b0[0];
            ppcVar10 = local_39c0[0];
            if (local_39c0[0] != local_39b0) goto LAB_0024ff71;
            goto LAB_0024ff79;
          }
        }
        else if (victim->pcdata->shifted < 0) {
          bVar4 = is_immortal(victim);
          if (bVar4) {
            sprintf(disp,"*   %s  *",pcVar8);
          }
          else {
            sprintf(disp,"[%2d %-5s %s]",(ulong)(uint)(int)victim->level,
                    pc_race_table[victim->race].who_name_five,class_name);
          }
          pcVar8 = "";
          if (victim->cabal == ch->cabal) {
            pcVar8 = cabal_table[victim->cabal].who_name;
          }
          bVar4 = is_npc(victim);
          pcVar9 = "";
          if (!bVar4) {
            pcVar9 = victim->pcdata->title;
          }
          bVar4 = is_npc(victim);
          local_3818 = "";
          if ((!bVar4) && (local_3818 = victim->pcdata->extitle, local_3818 == (char *)0x0)) {
            local_3818 = "";
          }
          local_3838[0] = *ppcVar10;
          local_3858._0_8_ = disp;
          fmt_00.size_ = 0xccccc;
          fmt_00.data_ = (char *)0xd;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)local_3858;
          local_3858._16_8_ = pcVar8;
          local_3828 = pcVar9;
          ::fmt::v9::vformat_abi_cxx11_(&local_3948,(v9 *)"{} {}{}{}{}\n\r",fmt_00,args_00);
          std::__cxx11::string::operator=((string *)&buffer,(string *)&local_3948);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3948._M_dataplus._M_p != &local_3948.field_2) {
            operator_delete(local_3948._M_dataplus._M_p,
                            (ulong)(local_3948.field_2._M_allocated_capacity + 1));
          }
          goto LAB_0024ff79;
        }
      }
      bVar4 = true;
LAB_0024ff8b:
      buffer_00 = local_39e8;
      pDVar12 = pDVar12->next;
    } while (pDVar12 != (DESCRIPTOR_DATA *)0x0);
    if (bVar4) {
      pcVar8 = buf_string(local_39e8);
      page_to_char(pcVar8,ch);
      free_buf(buffer_00);
      goto LAB_00250431;
    }
  }
  send_to_char("No one of that name is playing.\n\r",ch);
LAB_00250431:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buffer._M_dataplus._M_p != &buffer.field_2) {
    operator_delete(buffer._M_dataplus._M_p,
                    CONCAT71(buffer.field_2._M_allocated_capacity._1_7_,
                             buffer.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void do_whois(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Whois who?\n\r", ch);
		return;
	}

	std::string buffer;

	auto output = new_buf();
	auto found = false;
	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		char const *class_name;
		char const *imm_lvl;

		if (d->connected != CON_PLAYING || !can_see(ch, d->character))
			continue;

		auto wch = (d->original != nullptr) ? d->original : d->character;

		if (!can_see(ch, wch))
			continue;

		if (is_affected(d->character, gsn_disguise))
			continue;

		if (str_cmp(wch->name, wch->true_name)
			? is_immortal(ch)
				? !str_prefix(arg, wch->true_name) : 0
			: !str_prefix(arg, wch->name))
		{
			found = true;

			/* work out the printing */
			class_name = wch->Class()->who_name;
			switch (wch->level)
			{
				case MAX_LEVEL - 0:
					class_name = "IMP";
					imm_lvl = "Creator";
					break;
				case MAX_LEVEL - 1:
					class_name = "CRE";
					imm_lvl = " Elder ";
					break;
				case MAX_LEVEL - 2:
					class_name = "SUP";
					imm_lvl = " Elder ";
					break;
				case MAX_LEVEL - 3:
					class_name = "DEI";
					imm_lvl = "Greater";
					break;
				case MAX_LEVEL - 4:
					class_name = "GOD";
					imm_lvl = "Greater";
					break;
				case MAX_LEVEL - 5:
					class_name = "IMM";
					imm_lvl = "Greater";
					break;
				case MAX_LEVEL - 6:
					class_name = "DEM";
					imm_lvl = " Minor ";
					break;
				case MAX_LEVEL - 7:
					class_name = "ANG";
					imm_lvl = " Minor ";
					break;
				case MAX_LEVEL - 8:
					class_name = "AVA";
					imm_lvl = "Avatar ";
					break;
				default:
					imm_lvl = "";
					break;
			}

			char rbuf[MAX_STRING_LENGTH], disp[MAX_STRING_LENGTH];

			/* a little formatting */
			if (is_immortal(ch) || (is_heroimm(wch) && wch->level < 52))
			{
				if (get_trust(ch) >= 52)
					strcpy(rbuf, "  ");
				else
					strcpy(rbuf, "");

				buffer = fmt::sprintf("[%2d %-5s %s%s] %s%s%s%s%s%s%s%s%s%s%s%s\n\r",
					wch->level,
					pc_race_table[wch->race].who_name_five,
					class_name,
					get_trust(ch) >= 52 && wch->pcdata->history_buffer != nullptr ? " *" : rbuf,
					can_pk(ch, wch) ? "(PK) " : "",
					wch->incog_level >= LEVEL_HERO ? "(Incog) " : "",
					wch->invis_level >= LEVEL_HERO ? "(Wizi) " : "",
					cabal_table[wch->cabal].who_name,
					get_trust(ch) >= 57 && IS_SET(wch->act, PLR_MORON) ? "(MORON) " : "",
					IS_SET(wch->comm, COMM_AFK) && ch->level > 51 ? "[AFK] " : "",
					IS_SET(wch->act, PLR_CRIMINAL) ? "(WANTED) " : "",
					IS_SET(wch->act, PLR_THIEF) ? "(THIEF) " : "",
					isNewbie(wch) ? "(NEWBIE) " : "",
					wch->true_name,
					is_npc(wch) ? "" : wch->pcdata->title,
					is_npc(wch) ? "" : wch->pcdata->extitle ? wch->pcdata->extitle : "");
				add_buf(output, buffer.data());
			}
			else if (get_trust(wch) >= 52 && !is_immortal(ch))
			{
				if (wch->pcdata->shifted > -1)
					continue;

				if (is_immortal(wch))
					sprintf(disp, "*   %s  *", imm_lvl);
				else
					sprintf(disp, "[%2d %-5s %s]",
						wch->level,
						pc_race_table[wch->race].who_name_five,
						class_name);

				buffer = fmt::format("{} {}{}{}{}\n\r",
					disp,
					wch->cabal == ch->cabal ? cabal_table[wch->cabal].who_name : "",
					wch->name, 
					is_npc(wch) ? "" : wch->pcdata->title,
					is_npc(wch) ? "" : (wch->pcdata->extitle) ? wch->pcdata->extitle : ""); //TODO: change the rest of the sprintf calls to format

				add_buf(output, buffer.data());
			}
			else
			{
				if (wch->pcdata->shifted > -1)
					continue;

				if (is_immortal(wch))
					sprintf(disp, "*   %s  *", imm_lvl);
				else
					sprintf(disp, "[%2d %-5s %s]",
						wch->level,
						pc_race_table[wch->race].who_name_five,
						class_name);

				// TODO: originally had 13 placeholders, but it only has 12 arguments. could be a bug.
				buffer = fmt::format("{} {}{}{}{}{}{}{}{}{}{}{}\n\r",
					disp,
					can_pk(ch, wch) ? "(PK) " : "",
					wch->incog_level >= LEVEL_HERO ? "(Incog) " : "",
					wch->invis_level >= LEVEL_HERO ? "(Wizi) " : "",
					wch->cabal == ch->cabal || is_immortal(wch) ? cabal_table[wch->cabal].who_name : "", "",
					IS_SET(wch->comm, COMM_AFK) ? "[AFK] " : "",
					IS_SET(wch->act, PLR_CRIMINAL) ? "(WANTED) " : "",
					IS_SET(wch->act, PLR_THIEF) ? "(THIEF) " : "",
					isNewbie(wch) ? "(NEWBIE) " : "",
					wch->name,
					is_npc(wch) ? "" : wch->pcdata->title,
					is_npc(wch) ? "" : (wch->pcdata->extitle) ? wch->pcdata->extitle : "");
				add_buf(output, buffer.data());
			}
		}
	}

	if (!found)
	{
		send_to_char("No one of that name is playing.\n\r", ch);
		return;
	}

	page_to_char(buf_string(output), ch);
	free_buf(output);
}